

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVLABase<QAbstractButton_*>::resize_impl
          (QVLABase<QAbstractButton_*> *this,qsizetype prealloc,void *array,qsizetype sz,
          QAbstractButton **v)

{
  QAbstractButton **ppQVar1;
  long lVar2;
  long in_FS_OFFSET;
  QAbstractButton *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar1 = (QAbstractButton **)(this->super_QVLABaseBase).ptr;
  if ((v < ppQVar1) || (ppQVar1 + (this->super_QVLABaseBase).s <= v)) {
    lVar2 = (this->super_QVLABaseBase).a;
    if (lVar2 <= sz) {
      lVar2 = sz;
    }
    reallocate_impl(this,prealloc,array,sz,lVar2);
    lVar2 = (this->super_QVLABaseBase).s;
    if (lVar2 < sz) {
      do {
        *(QAbstractButton **)((long)(this->super_QVLABaseBase).ptr + lVar2 * 8) = *v;
        lVar2 = lVar2 + 1;
      } while (sz != lVar2);
      (this->super_QVLABaseBase).s = sz;
    }
  }
  else {
    local_28 = *v;
    resize_impl(this,prealloc,array,sz,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_impl(qsizetype prealloc, void *array, qsizetype sz, const T &v)
    {
        if (QtPrivate::q_points_into_range(&v, begin(), end())) {
            resize_impl(prealloc, array, sz, T(v));
            return;
        }
        reallocate_impl(prealloc, array, sz, qMax(sz, capacity()));
        while (size() < sz) {
            q20::construct_at(data() + size(), v);
            ++s;
        }
    }